

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::PassRunner::add
          (PassRunner *this,unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass)

{
  _Head_base<0UL,_wasm::Pass_*,_false> local_18;
  
  local_18._M_head_impl =
       (pass->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
  (pass->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl = (Pass *)0x0;
  (**(code **)(*(long *)this + 0x10))(this,&local_18);
  if (local_18._M_head_impl != (Pass *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Pass[1])();
  }
  return;
}

Assistant:

void add(std::unique_ptr<Pass> pass) { doAdd(std::move(pass)); }